

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

TriangleMesh * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::TriangleMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>,std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>,std::vector<int,std::allocator<int>>>
          (polymorphic_allocator<std::byte> *this,Transform *args,bool *args_1,
          vector<int,_std::allocator<int>_> *args_2,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *args_3,
          vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *args_4,
          vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *args_5,
          vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *args_6,
          vector<int,_std::allocator<int>_> *args_7)

{
  TriangleMesh *pTVar1;
  TriangleMesh *p;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *in_stack_00000090;
  vector<int,_std::allocator<int>_> *in_stack_00000098;
  bool *in_stack_000000a0;
  Transform *in_stack_000000a8;
  TriangleMesh *in_stack_000000b0;
  polymorphic_allocator<std::byte> *in_stack_000000b8;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *in_stack_000000d0;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *in_stack_000000d8;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *in_stack_000000e0;
  vector<int,_std::allocator<int>_> *in_stack_000000e8;
  size_t in_stack_ffffffffffffff98;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffffa0;
  
  pTVar1 = allocate_object<pbrt::TriangleMesh>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  construct<pbrt::TriangleMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>,std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>,std::vector<int,std::allocator<int>>>
            (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,
             in_stack_00000098,in_stack_00000090,in_stack_000000d0,in_stack_000000d8,
             in_stack_000000e0,in_stack_000000e8);
  return pTVar1;
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }